

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O0

bool jessilib::equalsi<char32_t,char8_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string_00;
  bool bVar1;
  decode_result dVar2;
  decode_result dVar3;
  bool local_72;
  byte local_71;
  decode_result rhs_front;
  decode_result lhs_front;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs_local;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs_local;
  
  rhs_local._M_str = (char8_t *)lhs._M_len;
  rhs_local._M_len = (size_t)rhs._M_str;
  lhs_front.units = rhs._M_len;
  while( true ) {
    bVar1 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::empty
                      ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&rhs_local._M_str
                      );
    local_71 = 0;
    if (!bVar1) {
      bVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::empty
                        ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&lhs_front.units)
      ;
      local_71 = bVar1 ^ 0xff;
    }
    if ((local_71 & 1) == 0) break;
    in_string_00._M_str = lhs._M_str;
    in_string_00._M_len = (size_t)rhs_local._M_str;
    dVar2 = decode_codepoint<char32_t>(in_string_00);
    lhs_front._0_8_ = dVar2.units;
    in_string._M_str = (char8_t *)rhs_local._M_len;
    in_string._M_len = lhs_front.units;
    dVar3 = decode_codepoint<char8_t>(in_string);
    if ((lhs_front._0_8_ == 0) || (dVar3.units == 0)) {
      return false;
    }
    bVar1 = equalsi(dVar2.codepoint,dVar3.codepoint);
    if (!bVar1) {
      return false;
    }
    std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::remove_prefix
              ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&rhs_local._M_str,
               lhs_front._0_8_);
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::remove_prefix
              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&lhs_front.units,
               dVar3.units);
  }
  bVar1 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::empty
                    ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&rhs_local._M_str);
  local_72 = false;
  if (bVar1) {
    local_72 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::empty
                         ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&lhs_front.units
                         );
  }
  return local_72;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}